

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RasterizerTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RasterizerTests::CoordinatesAreTranslatedAfterClipping(RasterizerTests *this)

{
  rect<float> rVar1;
  allocator local_591;
  string local_590 [32];
  LocationInfo local_570;
  uchar local_548 [8];
  uint8_t reference4 [30];
  allocator local_521;
  string local_520 [32];
  LocationInfo local_500;
  uchar auStack_4d8 [8];
  uint8_t reference2 [63];
  allocator local_491;
  string local_490 [32];
  LocationInfo local_470;
  allocator local_441;
  string local_440 [32];
  LocationInfo local_420;
  uchar local_3f8 [8];
  uint8_t reference1 [9];
  zero local_3c5;
  vector_i local_3c4;
  simple_alpha<unsigned_char,_8UL> local_3b9;
  blender<unsigned_char,_unsigned_char> local_3b8;
  zero local_395;
  vector_i local_394;
  simple_alpha<unsigned_char,_8UL> local_389;
  blender<unsigned_char,_unsigned_char> local_388;
  zero local_365;
  vector_i local_364;
  simple_alpha<unsigned_char,_8UL> local_359;
  blender<unsigned_char,_unsigned_char> local_358;
  zero local_339;
  vector_i local_338;
  rect<float> local_330;
  rect<float> local_320;
  rect<float> local_310;
  rect<float> local_300;
  undefined1 local_2f0 [8];
  renderer r;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
  r4;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
  r3;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
  r2;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_1>_>
  r1;
  bitmap<unsigned_char,_0UL,_0UL> b4;
  bitmap<unsigned_char,_0UL,_0UL> b3;
  undefined1 local_50 [8];
  bitmap<unsigned_char,_0UL,_0UL> b2;
  bitmap<unsigned_char,_0UL,_0UL> b1;
  RasterizerTests *this_local;
  
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)&b2._width,3,3);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)local_50,7,9);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)&b4._width,3,3);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)&r1._start_y,5,6);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_1>_>
  ::rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_1>_>
                *)&r2._start_y);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
  ::rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
                *)&r3._start_y);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
  ::rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
                *)&r4._start_y);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
  ::rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
                *)&r._scanline_cache._size);
  renderer::renderer((renderer *)local_2f0);
  rVar1 = create_rect<float>(0.5,0.640625,2.21875,2.75);
  local_300._8_8_ = rVar1._8_8_;
  local_300._0_8_ = rVar1._0_8_;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_1>_>
  ::set_clipping((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_1>_>
                  *)&r2._start_y,&local_300);
  rVar1 = create_rect<float>(0.5,0.640625,2.21875,2.75);
  local_310._8_8_ = rVar1._8_8_;
  local_310._0_8_ = rVar1._0_8_;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
  ::set_clipping((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
                  *)&r3._start_y,&local_310);
  rVar1 = create_rect<float>(0.5,0.640625,2.21875,2.75);
  local_320._8_8_ = rVar1._8_8_;
  local_320._0_8_ = rVar1._0_8_;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
  ::set_clipping((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
                  *)&r4._start_y,&local_320);
  rVar1 = create_rect<float>(0.5,0.640625,2.21875,2.75);
  local_330._8_8_ = rVar1._8_8_;
  local_330._0_8_ = rVar1._0_8_;
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
  ::set_clipping((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
                  *)&r._scanline_cache._size,&local_330);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_1>_>
  ::line_to((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_1>_>
             *)&r2._start_y,0.0,0.0);
  vector_rasterizer::sort((vector_rasterizer *)&r2._start_y,false);
  local_338 = zero::operator_cast_to_agge_vector(&local_339);
  local_358.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender(&local_358);
  renderer::operator()
            ((renderer *)local_2f0,(bitmap<unsigned_char,_0UL,_0UL> *)&b2._width,local_338,
             (rect_i *)0x0,
             (rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_1>_>
              *)&r2._start_y,&local_358,&local_359);
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender(&local_358);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
  ::line_to((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
             *)&r3._start_y,0.0,0.0);
  vector_rasterizer::sort((vector_rasterizer *)&r3._start_y,false);
  local_364 = zero::operator_cast_to_agge_vector(&local_365);
  local_388.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender(&local_388);
  renderer::operator()
            ((renderer *)local_2f0,(bitmap<unsigned_char,_0UL,_0UL> *)local_50,local_364,
             (rect_i *)0x0,
             (rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
              *)&r3._start_y,&local_388,&local_389);
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender(&local_388);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
  ::line_to((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
             *)&r4._start_y,0.0,0.0);
  vector_rasterizer::sort((vector_rasterizer *)&r4._start_y,false);
  local_394 = zero::operator_cast_to_agge_vector(&local_395);
  local_3b8.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender(&local_3b8);
  renderer::operator()
            ((renderer *)local_2f0,(bitmap<unsigned_char,_0UL,_0UL> *)&b4._width,local_394,
             (rect_i *)0x0,
             (rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
              *)&r4._start_y,&local_3b8,&local_3b9);
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender(&local_3b8);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
  ::line_to((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
             *)&r._scanline_cache._size,0.0,0.0);
  vector_rasterizer::sort((vector_rasterizer *)&r._scanline_cache._size,false);
  local_3c4 = zero::operator_cast_to_agge_vector(&local_3c5);
  stack0xfffffffffffffc18 = 0;
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender
            ((blender<unsigned_char,_unsigned_char> *)(reference1 + 8));
  renderer::operator()
            ((renderer *)local_2f0,(bitmap<unsigned_char,_0UL,_0UL> *)&r1._start_y,local_3c4,
             (rect_i *)0x0,
             (rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
              *)&r._scanline_cache._size,(blender<unsigned_char,_unsigned_char> *)(reference1 + 8),
             (simple_alpha<unsigned_char,_8UL> *)(reference1 + 7));
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender
            ((blender<unsigned_char,_unsigned_char> *)(reference1 + 8));
  local_3f8[0] = '.';
  local_3f8[1] = '\\';
  local_3f8[2] = '\x14';
  local_3f8[3] = 0x80;
  local_3f8[4] = 0xff;
  local_3f8[5] = '8';
  local_3f8[6] = '`';
  local_3f8[7] = 0xc0;
  reference1[0] = '*';
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_440,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
             ,&local_441);
  ut::LocationInfo::LocationInfo(&local_420,(string *)local_440,0xfe);
  ut::are_equal<unsigned_char,9ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [9])local_3f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&b2._width,&local_420);
  ut::LocationInfo::~LocationInfo(&local_420);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator((allocator<char> *)&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_490,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
             ,&local_491);
  ut::LocationInfo::LocationInfo(&local_470,(string *)local_490,0xff);
  ut::are_equal<unsigned_char,9ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [9])local_3f8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&b4._width,&local_470);
  ut::LocationInfo::~LocationInfo(&local_470);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  reference2[0x28] = 0xa8;
  reference2[0x29] = '\0';
  reference2[0x2a] = 0x80;
  reference2[0x2b] = 0xff;
  reference2[0x2c] = 0xff;
  reference2[0x2d] = 0xff;
  reference2[0x2e] = 0xff;
  reference2[0x2f] = 0xa8;
  reference2[0x30] = '\0';
  reference2[0x31] = ' ';
  reference2[0x32] = '@';
  reference2[0x33] = '@';
  reference2[0x34] = '@';
  reference2[0x35] = '@';
  reference2[0x36] = '*';
  reference2[0x18] = 0xff;
  reference2[0x19] = 0xff;
  reference2[0x1a] = 0xa8;
  reference2[0x1b] = '\0';
  reference2[0x1c] = 0x80;
  reference2[0x1d] = 0xff;
  reference2[0x1e] = 0xff;
  reference2[0x1f] = 0xff;
  reference2[0x20] = 0xff;
  reference2[0x21] = 0xa8;
  reference2[0x22] = '\0';
  reference2[0x23] = 0x80;
  reference2[0x24] = 0xff;
  reference2[0x25] = 0xff;
  reference2[0x26] = 0xff;
  reference2[0x27] = 0xff;
  reference2[8] = 0xff;
  reference2[9] = 0xff;
  reference2[10] = 0xff;
  reference2[0xb] = 0xff;
  reference2[0xc] = 0xa8;
  reference2[0xd] = '\0';
  reference2[0xe] = 0x80;
  reference2[0xf] = 0xff;
  reference2[0x10] = 0xff;
  reference2[0x11] = 0xff;
  reference2[0x12] = 0xff;
  reference2[0x13] = 0xa8;
  reference2[0x14] = '\0';
  reference2[0x15] = 0x80;
  reference2[0x16] = 0xff;
  reference2[0x17] = 0xff;
  auStack_4d8[0] = '\0';
  auStack_4d8[1] = '\0';
  auStack_4d8[2] = '\0';
  auStack_4d8[3] = '\0';
  auStack_4d8[4] = '\0';
  auStack_4d8[5] = '\0';
  auStack_4d8[6] = '\0';
  auStack_4d8[7] = '\0';
  builtin_memcpy(reference2,"\n\x14\x14\x14\x14\r",7);
  reference2[7] = 0x80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_520,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
             ,&local_521);
  ut::LocationInfo::LocationInfo(&local_500,(string *)local_520,0x10d);
  ut::are_equal<unsigned_char,63ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [63])auStack_4d8,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,&local_500);
  ut::LocationInfo::~LocationInfo(&local_500);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator((allocator<char> *)&local_521);
  reference4[8] = 0xff;
  reference4[9] = 0xff;
  reference4[10] = 0xff;
  reference4[0xb] = 'p';
  reference4[0xc] = '\0';
  reference4[0xd] = 0xff;
  reference4[0xe] = 0xff;
  reference4[0xf] = 0xff;
  reference4[0x10] = 'p';
  reference4[0x11] = '\0';
  reference4[0x12] = 0x80;
  reference4[0x13] = 0x80;
  reference4[0x14] = 0x80;
  reference4[0x15] = '8';
  local_548[0] = '\0';
  local_548[1] = '\0';
  local_548[2] = '\0';
  local_548[3] = '\0';
  local_548[4] = '\0';
  local_548[5] = '\0';
  local_548[6] = 0xb8;
  local_548[7] = 0xb8;
  reference4[0] = 0xb8;
  reference4[1] = 'P';
  reference4[2] = '\0';
  reference4[3] = 0xff;
  reference4[4] = 0xff;
  reference4[5] = 0xff;
  reference4[6] = 'p';
  reference4[7] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_590,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RasterizerTests.cpp"
             ,&local_591);
  ut::LocationInfo::LocationInfo(&local_570,(string *)local_590,0x118);
  ut::are_equal<unsigned_char,30ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [30])local_548,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&r1._start_y,&local_570);
  ut::LocationInfo::~LocationInfo(&local_570);
  std::__cxx11::string::~string(local_590);
  std::allocator<char>::~allocator((allocator<char> *)&local_591);
  renderer::~renderer((renderer *)local_2f0);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
  ::~rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_2>_>
                 *)&r._scanline_cache._size);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
  ::~rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<float>,_agge::tests::(anonymous_namespace)::scaling_r<1,_1>_>
                 *)&r4._start_y);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
  ::~rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_3>_>
                 *)&r3._start_y);
  rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_1>_>
  ::~rasterizer((rasterizer<agge::tests::(anonymous_namespace)::emitting_clipper<int>,_agge::tests::(anonymous_namespace)::scaling_i<1,_1>_>
                 *)&r2._start_y);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::~bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)&r1._start_y);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::~bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)&b4._width);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::~bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)local_50);
  tests::mocks::bitmap<unsigned_char,_0UL,_0UL>::~bitmap
            ((bitmap<unsigned_char,_0UL,_0UL> *)&b2._width);
  return;
}

Assistant:

test( CoordinatesAreTranslatedAfterClipping )
			{
				// INIT
				mocks::bitmap<uint8_t> b1(3, 3), b2(7, 9), b3(3, 3), b4(5, 6);
				rasterizer< emitting_clipper<int>, scaling_i<1, 1> > r1;
				rasterizer< emitting_clipper<int>, scaling_i<1, 3> > r2;
				rasterizer< emitting_clipper<real_t>, scaling_r<1, 1> > r3;
				rasterizer< emitting_clipper<real_t>, scaling_r<1, 2> > r4;
				renderer r;

				r1.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 2.75f));
				r2.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 2.75f));
				r3.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 2.75f));
				r4.set_clipping(create_rect<real_t>(0.5f, 0.640625f, 2.21875f, 2.75f));

				// ACT
				r1.line_to(0.0f, 0.0f);
				r1.sort();
				r(b1, zero(), 0, r1, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				r2.line_to(0.0f, 0.0f);
				r2.sort();
				r(b2, zero(), 0, r2, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				r3.line_to(0.0f, 0.0f);
				r3.sort();
				r(b3, zero(), 0, r3, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				r4.line_to(0.0f, 0.0f);
				r4.sort();
				r(b4, zero(), 0, r4, mocks::blender<uint8_t, uint8_t>(), mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference1[] = {
					0x2e, 0x5c, 0x14,
					0x80, 0xff, 0x38,
					0x60, 0xc0, 0x2a,
				};

				assert_equal(reference1, b1.data);
				assert_equal(reference1, b3.data);

				uint8_t reference2[] = {
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x0a, 0x14, 0x14, 0x14, 0x14, 0x0d,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x80, 0xff, 0xff, 0xff, 0xff, 0xa8,
					0x00, 0x20, 0x40, 0x40, 0x40, 0x40, 0x2a,
				};

				assert_equal(reference2, b2.data);

				uint8_t reference4[] = {
					0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0xB8, 0xB8, 0xB8, 0x50,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0xFF, 0xFF, 0xFF, 0x70,
					0x00, 0x80, 0x80, 0x80, 0x38,
				};

				assert_equal(reference4, b4.data);
			}